

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::peekNext(QRegularExpressionMatchIterator *this)

{
  long lVar1;
  long *in_RSI;
  long lVar2;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RSI;
  lVar1 = *(long *)(lVar2 + 8);
  if ((*(char *)(lVar1 + 0x5e) != '\x01') ||
     ((*(char *)(lVar1 + 0x5c) == '\0' && (*(char *)(lVar1 + 0x5d) == '\0')))) {
    local_38.context.version = 2;
    local_38.context._4_8_ = 0;
    local_38.context._12_8_ = 0;
    local_38.context.function._4_4_ = 0;
    local_38.context.category = "default";
    QMessageLogger::warning
              (&local_38,
               "QRegularExpressionMatchIterator::peekNext() called on an iterator already at end");
    lVar2 = *in_RSI;
  }
  QRegularExpressionMatch::QRegularExpressionMatch
            ((QRegularExpressionMatch *)this,(QRegularExpressionMatch *)(lVar2 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::peekNext() const
{
    if (!hasNext())
        qWarning("QRegularExpressionMatchIterator::peekNext() called on an iterator already at end");

    return d->next;
}